

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::reportIfCannotBeNull
          (CheckerVisitor *this,Expr *checkee,Expr *n,char *loc)

{
  int iVar1;
  TreeOp TVar2;
  Expr *pEVar4;
  Expr *pEVar5;
  ulong uVar3;
  
  TVar2 = (checkee->super_Node)._op;
  if (TVar2 == TO_NULLC) {
    checkee = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,false);
    TVar2 = (checkee->super_Node)._op;
  }
  uVar3 = (ulong)(TVar2 - TO_OR);
  if (0x2d < TVar2 - TO_OR) {
    return;
  }
  if ((0xf87c0dffffU >> (uVar3 & 0x3f) & 1) == 0) {
    if (uVar3 == 0x22) {
      iVar1 = *(int *)&(checkee->super_Node).field_0x1c;
    }
    else {
      if (uVar3 != 0x2d) {
        return;
      }
      pEVar4 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,false);
      pEVar5 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates.lineEnd,false);
      uVar3 = (ulong)(pEVar4->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 != 0x39) {
          return;
        }
        if (*(int *)&(pEVar4->super_Node).field_0x1c == 4) {
          return;
        }
      }
      uVar3 = (ulong)(pEVar5->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_00143f44;
      if (uVar3 != 0x39) {
        return;
      }
      iVar1 = *(int *)&(pEVar5->super_Node).field_0x1c;
    }
    if (iVar1 == 4) {
      return;
    }
  }
LAB_00143f44:
  report(this,&n->super_Node,0x7a,loc);
  return;
}

Assistant:

void CheckerVisitor::reportIfCannotBeNull(const Expr *checkee, const Expr *n, const char *loc) {
  assert(n);

  if (checkee->op() == TO_NULLC) {
    checkee = maybeEval(static_cast<const BinExpr *>(checkee)->rhs());
  }

  if (checkee->op() == TO_TERNARY) {
    const TerExpr *ter = static_cast<const TerExpr *>(checkee);
    const Expr *ifTrue = maybeEval(ter->b());
    const Expr *ifFalse = maybeEval(ter->c());

    if (cannotBeNull(ifTrue) && cannotBeNull(ifFalse)) {
      report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
    }
    return;
  }

  if (cannotBeNull(checkee))
    report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
}